

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O3

REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,REF_DICT original)

{
  uint uVar1;
  int iVar2;
  REF_DICT pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  undefined8 uVar6;
  ulong uVar7;
  REF_INT RVar8;
  REF_INT RVar9;
  char *pcVar10;
  size_t __size;
  bool bVar11;
  
  pRVar3 = (REF_DICT)malloc(0x20);
  *ref_dict_ptr = pRVar3;
  if (pRVar3 == (REF_DICT)0x0) {
    pcVar10 = "malloc *ref_dict_ptr of REF_DICT_STRUCT NULL";
    uVar6 = 0x39;
  }
  else {
    uVar1 = original->n;
    pRVar3->n = uVar1;
    iVar2 = original->max;
    pRVar3->max = iVar2;
    if ((long)iVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x40,
             "ref_dict_deep_copy","malloc ref_dict->key of REF_INT negative");
      return 1;
    }
    __size = (long)iVar2 << 2;
    pRVar4 = (REF_INT *)malloc(__size);
    pRVar3->key = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar10 = "malloc ref_dict->key of REF_INT NULL";
      uVar6 = 0x40;
    }
    else {
      pRVar5 = (REF_INT *)malloc(__size);
      pRVar3->value = pRVar5;
      if (pRVar5 != (REF_INT *)0x0) {
        if ((int)uVar1 < 1) {
          return 0;
        }
        RVar8 = *original->key;
        RVar9 = *original->value;
        uVar7 = 1;
        do {
          pRVar4[uVar7 - 1] = RVar8;
          pRVar5[uVar7 - 1] = RVar9;
          RVar8 = -1;
          RVar9 = -1;
          if (uVar7 < uVar1) {
            RVar8 = original->key[uVar7];
            RVar9 = original->value[uVar7];
          }
          bVar11 = uVar7 != uVar1;
          uVar7 = uVar7 + 1;
        } while (bVar11);
        return 0;
      }
      pcVar10 = "malloc ref_dict->value of REF_INT NULL";
      uVar6 = 0x41;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",uVar6,
         "ref_dict_deep_copy",pcVar10);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_dict_deep_copy(REF_DICT *ref_dict_ptr,
                                      REF_DICT original) {
  REF_DICT ref_dict;
  REF_INT key_index, dict_key, dict_value;

  ref_malloc(*ref_dict_ptr, 1, REF_DICT_STRUCT);

  ref_dict = (*ref_dict_ptr);

  ref_dict_n(ref_dict) = ref_dict_n(original);
  ref_dict_max(ref_dict) = ref_dict_max(original);

  ref_malloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
  ref_malloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);

  each_ref_dict_key_value(original, key_index, dict_key, dict_value) {
    ref_dict_key(ref_dict, key_index) = dict_key;
    ref_dict_keyvalue(ref_dict, key_index) = dict_value;
  }

  return REF_SUCCESS;
}